

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void sptk::world::GetMinimumPhaseSpectrum(MinimumPhaseAnalysis *minimum_phase)

{
  double dVar1;
  double dVar2;
  fft_plan p;
  fft_plan p_00;
  int iVar3;
  double *pdVar4;
  long lVar5;
  int *in_RDI;
  double *unaff_retaddr;
  int i_3;
  double tmp;
  int i_2;
  int i_1;
  int i;
  int local_b4;
  undefined1 local_a8 [72];
  int local_60;
  int local_5c;
  undefined1 local_58 [24];
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar3 = *in_RDI / 2;
  while (iVar3 = iVar3 + 1, iVar3 < *in_RDI) {
    *(undefined8 *)(*(long *)(in_RDI + 2) + (long)iVar3 * 8) =
         *(undefined8 *)(*(long *)(in_RDI + 2) + (long)(*in_RDI - iVar3) * 8);
  }
  memcpy(local_58,in_RDI + 8,0x48);
  p._8_8_ = in_stack_ffffffffffffffc8;
  p.n = (int)in_stack_ffffffffffffffc0;
  p.sign = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  p.c_in = (fft_complex *)in_stack_ffffffffffffffd0;
  p.in = (double *)in_stack_ffffffffffffffd8;
  p.c_out = (fft_complex *)in_stack_ffffffffffffffe0;
  p.out = (double *)in_stack_ffffffffffffffe8;
  p.input._0_4_ = in_stack_fffffffffffffff0;
  p.input._4_4_ = iVar3;
  p.ip = in_RDI;
  p.w = unaff_retaddr;
  fft_execute(p);
  *(double *)(*(long *)(in_RDI + 6) + 8) = *(double *)(*(long *)(in_RDI + 6) + 8) * -1.0;
  for (local_5c = 1; local_5c < *in_RDI / 2; local_5c = local_5c + 1) {
    pdVar4 = (double *)(*(long *)(in_RDI + 6) + (long)local_5c * 0x10);
    *pdVar4 = *pdVar4 * 2.0;
    lVar5 = *(long *)(in_RDI + 6) + (long)local_5c * 0x10;
    *(double *)(lVar5 + 8) = *(double *)(lVar5 + 8) * -2.0;
  }
  lVar5 = *(long *)(in_RDI + 6) + (long)(*in_RDI / 2) * 0x10;
  *(double *)(lVar5 + 8) = *(double *)(lVar5 + 8) * -1.0;
  local_60 = *in_RDI / 2;
  while (local_60 = local_60 + 1, local_60 < *in_RDI) {
    *(undefined8 *)(*(long *)(in_RDI + 6) + (long)local_60 * 0x10) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 6) + (long)local_60 * 0x10 + 8) = 0;
  }
  memcpy(local_a8,in_RDI + 0x1a,0x48);
  p_00._8_8_ = in_stack_ffffffffffffffc8;
  p_00.n = (int)in_stack_ffffffffffffffc0;
  p_00.sign = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  p_00.c_in = (fft_complex *)in_stack_ffffffffffffffd0;
  p_00.in = (double *)in_stack_ffffffffffffffd8;
  p_00.c_out = (fft_complex *)in_stack_ffffffffffffffe0;
  p_00.out = (double *)in_stack_ffffffffffffffe8;
  p_00.input._0_4_ = in_stack_fffffffffffffff0;
  p_00.input._4_4_ = iVar3;
  p_00.ip = in_RDI;
  p_00.w = unaff_retaddr;
  fft_execute(p_00);
  for (local_b4 = 0; local_b4 <= *in_RDI / 2; local_b4 = local_b4 + 1) {
    dVar1 = exp(*(double *)(*(long *)(in_RDI + 4) + (long)local_b4 * 0x10) / (double)*in_RDI);
    dVar2 = cos(*(double *)(*(long *)(in_RDI + 4) + (long)local_b4 * 0x10 + 8) / (double)*in_RDI);
    *(double *)(*(long *)(in_RDI + 4) + (long)local_b4 * 0x10) = dVar1 * dVar2;
    dVar2 = sin(*(double *)(*(long *)(in_RDI + 4) + (long)local_b4 * 0x10 + 8) / (double)*in_RDI);
    *(double *)(*(long *)(in_RDI + 4) + (long)local_b4 * 0x10 + 8) = dVar1 * dVar2;
  }
  return;
}

Assistant:

void GetMinimumPhaseSpectrum(const MinimumPhaseAnalysis *minimum_phase) {
  // Mirroring
  for (int i = minimum_phase->fft_size / 2 + 1;
      i < minimum_phase->fft_size; ++i)
    minimum_phase->log_spectrum[i] =
    minimum_phase->log_spectrum[minimum_phase->fft_size - i];

  // This fft_plan carries out "forward" FFT.
  // To carriy out the Inverse FFT, the sign of imaginary part
  // is inverted after FFT.
  fft_execute(minimum_phase->inverse_fft);
  minimum_phase->cepstrum[0][1] *= -1.0;
  for (int i = 1; i < minimum_phase->fft_size / 2; ++i) {
    minimum_phase->cepstrum[i][0] *= 2.0;
    minimum_phase->cepstrum[i][1] *= -2.0;
  }
  minimum_phase->cepstrum[minimum_phase->fft_size / 2][1] *= -1.0;
  for (int i = minimum_phase->fft_size / 2 + 1;
      i < minimum_phase->fft_size; ++i) {
    minimum_phase->cepstrum[i][0] = 0.0;
    minimum_phase->cepstrum[i][1] = 0.0;
  }

  fft_execute(minimum_phase->forward_fft);

  // Since x is complex number, calculation of exp(x) is as following.
  // Note: This FFT library does not keep the aliasing.
  double tmp;
  for (int i = 0; i <= minimum_phase->fft_size / 2; ++i) {
    tmp = exp(minimum_phase->minimum_phase_spectrum[i][0] /
      minimum_phase->fft_size);
    minimum_phase->minimum_phase_spectrum[i][0] = tmp *
      cos(minimum_phase->minimum_phase_spectrum[i][1] /
      minimum_phase->fft_size);
    minimum_phase->minimum_phase_spectrum[i][1] = tmp *
      sin(minimum_phase->minimum_phase_spectrum[i][1] /
      minimum_phase->fft_size);
  }
}